

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O2

void __thiscall adios2::transport::ShmSystemV::~ShmSystemV(ShmSystemV *this)

{
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__ShmSystemV_00824a90;
  if ((this->super_Transport).m_IsOpen == true) {
    shmdt(this->m_Buffer);
    if (this->m_RemoveAtClose == true) {
      shmctl(this->m_ShmID,0,(shmid_ds *)0x0);
    }
  }
  std::__cxx11::string::~string((string *)&this->m_PathName);
  Transport::~Transport(&this->super_Transport);
  return;
}

Assistant:

ShmSystemV::~ShmSystemV() // this might not be correct
{
    if (m_IsOpen)
    {
        shmdt(m_Buffer);

        if (m_RemoveAtClose)
        {
            shmctl(m_ShmID, IPC_RMID, NULL);
        }
    }
}